

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_inf_norm_rows(csc *M,c_float *E)

{
  long lVar1;
  c_float local_40;
  c_float local_38;
  double local_30;
  c_int ptr;
  c_int j;
  c_int i;
  c_float *E_local;
  csc *M_local;
  
  for (j = 0; j < M->m; j = j + 1) {
    E[j] = 0.0;
  }
  for (j = 0; j < M->n; j = j + 1) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr = ptr + 1) {
      lVar1 = M->i[ptr];
      if (0.0 < M->x[ptr] || M->x[ptr] == 0.0) {
        local_30 = M->x[ptr];
      }
      else {
        local_30 = -M->x[ptr];
      }
      if (local_30 < E[lVar1] || local_30 == E[lVar1]) {
        local_40 = E[lVar1];
      }
      else {
        if (0.0 < M->x[ptr] || M->x[ptr] == 0.0) {
          local_38 = M->x[ptr];
        }
        else {
          local_38 = -M->x[ptr];
        }
        local_40 = local_38;
      }
      E[lVar1] = local_40;
    }
  }
  return;
}

Assistant:

void mat_inf_norm_rows(const csc *M, c_float *E) {
  c_int i, j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->m; j++) {
    E[j] = 0.;
  }

  // Compute maximum across rows
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i    = M->i[ptr];
      E[i] = c_max(c_absval(M->x[ptr]), E[i]);
    }
  }
}